

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.h
# Opt level: O0

void __thiscall bloaty::Options::add_data_source(Options *this,string *value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  
  pbVar1 = google::protobuf::
           RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::Add((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x16d49c);
  std::__cxx11::string::assign((string *)pbVar1);
  return;
}

Assistant:

inline void Options::add_data_source(const std::string& value) {
  data_source_.Add()->assign(value);
  // @@protoc_insertion_point(field_add:bloaty.Options.data_source)
}